

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

int alloca_arg_p(gen_ctx_t gen_ctx,MIR_insn_t call_insn)

{
  void *pvVar1;
  int iVar2;
  ulong local_38;
  size_t i;
  ssa_edge_t_conflict se;
  MIR_proto_t proto;
  MIR_insn_t call_insn_local;
  gen_ctx_t gen_ctx_local;
  
  iVar2 = MIR_call_code_p((MIR_insn_code_t)*(undefined8 *)&call_insn->field_0x18);
  if (((iVar2 != 0) && ((*(ushort *)&call_insn->ops[0].field_0x8 & 0xff) == 8)) &&
     ((call_insn->ops[0].u.ref)->item_type == MIR_proto_item)) {
    local_38 = (ulong)(*(int *)(*(long *)((long)&(call_insn->ops[0].u.label)->ops[0].u + 0x10) + 8)
                      + 1);
    while( true ) {
      if (*(ulong *)&call_insn->field_0x18 >> 0x20 <= local_38) {
        return 0;
      }
      if ((((*(ushort *)&call_insn->ops[local_38].field_0x8 & 0xff) == 2) ||
          ((*(ushort *)&call_insn->ops[local_38].field_0x8 & 0xff) == 0xb)) &&
         ((pvVar1 = call_insn->ops[local_38].data, pvVar1 != (void *)0x0 &&
          (((*(byte *)(*(long *)((long)pvVar1 + 8) + 9) & 2) != 0 ||
           ((*(byte *)(*(long *)((long)pvVar1 + 8) + 9) & 1) != 0)))))) break;
      local_38 = local_38 + 1;
    }
    return 1;
  }
  __assert_fail("MIR_call_code_p (call_insn->code) && call_insn->ops[0].mode == MIR_OP_REF && call_insn->ops[0].u.ref->item_type == MIR_proto_item"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x135b,"int alloca_arg_p(gen_ctx_t, MIR_insn_t)");
}

Assistant:

static int alloca_arg_p (gen_ctx_t gen_ctx MIR_UNUSED, MIR_insn_t call_insn) {
  MIR_proto_t proto;
  ssa_edge_t se;

  gen_assert (MIR_call_code_p (call_insn->code) && call_insn->ops[0].mode == MIR_OP_REF
              && call_insn->ops[0].u.ref->item_type == MIR_proto_item);
  proto = call_insn->ops[0].u.ref->u.proto;
  for (size_t i = proto->nres + 1; i < call_insn->nops; i++) {
    if (call_insn->ops[i].mode != MIR_OP_VAR && call_insn->ops[i].mode != MIR_OP_VAR_MEM) continue;
    if ((se = call_insn->ops[i].data) == NULL) continue;
    if ((se->def->alloca_flag & MUST_ALLOCA) || (se->def->alloca_flag & MAY_ALLOCA)) return TRUE;
  }
  return FALSE;
}